

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::IsSlotCurveHovered(void)

{
  char *slot_title_00;
  void *node_id_00;
  void *this;
  bool bVar1;
  int iVar2;
  ImU32 key;
  bool local_35;
  int local_34;
  char *pcStack_30;
  int slot_kind;
  char *slot_title;
  void *node_id;
  _CanvasStateImpl *impl;
  CanvasState *canvas;
  
  if (gCanvas != (_CanvasStateImpl *)0x0) {
    impl = gCanvas;
    node_id = *(void **)&gCanvas->ignore_connections;
    bVar1 = GetPendingConnection(&slot_title,&stack0xffffffffffffffd0,&local_34);
    this = node_id;
    if (bVar1) {
      local_35 = false;
      if (slot_title == *(char **)((long)node_id + 0x10)) {
        iVar2 = strcmp(pcStack_30,*(char **)((long)node_id + 0x30));
        local_35 = false;
        if (iVar2 == 0) {
          local_35 = local_34 == *(int *)((long)node_id + 0x28);
        }
      }
      canvas._7_1_ = local_35;
    }
    else {
      slot_title_00 = *(char **)((long)node_id + 0x30);
      node_id_00 = *(void **)((long)node_id + 0x10);
      bVar1 = IsInputSlotKind(*(int *)((long)node_id + 0x28));
      key = MakeSlotDataID("hovered",slot_title_00,node_id_00,bVar1);
      canvas._7_1_ = ImGuiStorage::GetBool((ImGuiStorage *)this,key,false);
    }
    return canvas._7_1_;
  }
  __assert_fail("gCanvas != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x31a,"bool ImNodes::IsSlotCurveHovered()");
}

Assistant:

bool IsSlotCurveHovered()
{
    assert(gCanvas != nullptr);
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    void* node_id;
    const char* slot_title;
    int slot_kind;
    if (ImNodes::GetPendingConnection(&node_id, &slot_title, &slot_kind))
    {
        // In-progress connection to current slot is hovered
        return node_id == impl->node.id && strcmp(slot_title, impl->slot.title) == 0 &&
               slot_kind == impl->slot.kind;
    }

    // Actual curve is hovered
    return impl->cached_data.GetBool(MakeSlotDataID("hovered", impl->slot.title, impl->node.id,
           IsInputSlotKind(impl->slot.kind)));
}